

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

ssize_t __thiscall
cppurses::Key::Press::send(Press *this,int __fd,void *__buf,size_t __n,int __flags)

{
  short sVar1;
  bool bVar2;
  int16_t value;
  uint uVar3;
  ulong unaff_RBP;
  
  sVar1 = *(short *)&(this->super_Event).super_Input_event.field_0x1c;
  if (sVar1 == 9) {
    unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1);
    bVar2 = Focus::tab_press();
    if (bVar2) goto LAB_0014e65d;
    sVar1 = *(short *)&(this->super_Event).super_Input_event.field_0x1c;
  }
  if (sVar1 == 0x161) {
    unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1);
    bVar2 = Focus::shift_tab_press();
    if (bVar2) goto LAB_0014e65d;
  }
  uVar3 = (*((this->super_Event).super_Input_event.super_Event.receiver_)->_vptr_Widget[0x10])();
  unaff_RBP = (ulong)uVar3;
LAB_0014e65d:
  return unaff_RBP & 0xffffffff;
}

Assistant:

bool Key::Press::send() const {
    if (key_ == Code::Tab && Focus::tab_press()) {
        return true;
    }
    if (key_ == Code::Back_tab && Focus::shift_tab_press()) {
        return true;
    }
    return receiver_.key_press_event(Key::State{key_, key_to_char(key_)});
}